

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O2

double CEDate::CurrentJD(void)

{
  initializer_list<double> __l;
  allocator<double> local_a9;
  double local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<double,_std::allocator<double>_> date_info;
  time_t now;
  double local_68;
  double dStack_60;
  double local_58;
  double local_50;
  tm current_jd;
  
  time(&now);
  gmtime_r(&now,(tm *)&current_jd);
  local_68 = (double)current_jd.tm_year + 1900.0;
  dStack_60 = (double)current_jd.tm_mon + 1.0;
  local_58 = (double)current_jd.tm_mday;
  local_50 = CETime::CurrentUTC();
  local_50 = local_50 / 86400.0;
  std::allocator<double>::allocator(&local_a9);
  __l._M_len = 4;
  __l._M_array = &local_68;
  std::vector<double,_std::allocator<double>_>::vector(&date_info,__l,&local_a9);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_a9);
  std::vector<double,_std::allocator<double>_>::vector(&local_a0,&date_info);
  local_a8 = GregorianVect2JD(&local_a0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_a0);
  std::vector<double,_std::allocator<double>_>::~vector(&date_info);
  return local_a8;
}

Assistant:

double CEDate::CurrentJD()
{
    // Get the current date information
    time_t now ;
    time (&now) ;
    struct tm current_jd;
    gmtime_r(&now, &current_jd) ;
    
    // Put this into a vector
    std::vector<double> date_info = {current_jd.tm_year+1900.0,
                                     current_jd.tm_mon+1.0,
                                     current_jd.tm_mday*1.0,
                                     CETime::CurrentUTC()/DAYSEC} ;
    
    // Convert the Gregorian date information into a Julian date
    return GregorianVect2JD( date_info ) ;
}